

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

void booster::aio::socket_pair(stream_socket *s1,stream_socket *s2)

{
  error_code eVar1;
  int iVar2;
  undefined8 uVar3;
  error_code eVar4;
  int fds [2];
  native_type in_stack_ffffffffffffffcc;
  system_error *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffdc;
  int local_18 [6];
  
  iVar2 = socketpair(1,1,0,local_18);
  if (iVar2 < 0) {
    uVar3 = __cxa_allocate_exception(0x40);
    eVar4 = socket_details::geterror();
    eVar1._4_4_ = in_stack_ffffffffffffffdc;
    eVar1._M_value = eVar4._M_value;
    eVar1._M_cat = eVar4._M_cat;
    system::system_error::system_error(in_stack_ffffffffffffffd0,eVar1);
    __cxa_throw(uVar3,&system::system_error::typeinfo,system::system_error::~system_error);
  }
  basic_io_device::assign((basic_io_device *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  basic_io_device::assign((basic_io_device *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

void socket_pair(stream_socket &s1,stream_socket &s2)
{
#ifdef BOOSTER_AIO_NO_PF_UNIX
	acceptor a;
	a.open(pf_inet);
	a.set_option(acceptor::reuse_address,true);
	a.bind(endpoint("127.0.0.1",0));
	a.listen(1);
	s1.open(pf_inet);
	s1.connect(a.local_endpoint());
	a.accept(s2);
	a.close();
#else
	int fds[2];
	if(::socketpair(AF_UNIX,SOCK_STREAM,0,fds) < 0)
		throw system::system_error(geterror());
	s1.assign(fds[0]);
	s2.assign(fds[1]);
#endif
}